

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solve_algorithms.cpp
# Opt level: O3

void __thiscall Clasp::SequentialSolve::doStart(SequentialSolve *this,SharedContext *ctx,LitVec *gp)

{
  Solver *pSVar1;
  uint64 uVar2;
  bool bVar3;
  BasicSolve *x;
  Params *pPVar4;
  long *plVar5;
  
  x = (BasicSolve *)operator_new(0x28);
  pSVar1 = *(ctx->solvers_).ebo_.buf;
  plVar5 = (long *)((ctx->config_).ptr_ & 0xfffffffffffffffe);
  pPVar4 = (Params *)(**(code **)(*plVar5 + 0x38))(plVar5,0);
  x->solver_ = pSVar1;
  x->params_ = pPVar4;
  uVar2 = (this->super_SolveAlgorithm).limits_.restarts;
  (x->limits_).conflicts = (this->super_SolveAlgorithm).limits_.conflicts;
  (x->limits_).restarts = uVar2;
  x->state_ = (State *)0x0;
  SingleOwnerPtr<Clasp::BasicSolve,_Clasp::DeleteObject>::reset(&this->solve_,x);
  bVar3 = Enumerator::start((Enumerator *)
                            ((this->super_SolveAlgorithm).enum_.ptr_ & 0xfffffffffffffffe),
                            *(Solver **)((this->solve_).ptr_ & 0xfffffffffffffffe),gp,false);
  if (bVar3) {
    return;
  }
  doStop(this);
  return;
}

Assistant:

void SequentialSolve::doStart(SharedContext& ctx, const LitVec& gp) {
	solve_.reset(new BasicSolve(*ctx.master(), ctx.configuration()->search(0), limits()));
	if (!enumerator().start(solve_->solver(), gp)) { SequentialSolve::doStop(); }
}